

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O3

void * stbds_hmput_key(void *a,size_t elemsize,void *key,size_t keysize,int mode)

{
  uchar uVar1;
  stbds_hash_index *ot;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  undefined8 *puVar6;
  stbds_hash_index *psVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  void *__dest;
  char *pcVar11;
  stbds_hash_bucket *psVar12;
  ulong uVar13;
  ulong uVar14;
  void *a_00;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong local_80;
  long local_48;
  
  if (a == (void *)0x0) {
    puVar6 = (undefined8 *)malloc(elemsize * 4 + 0x20);
    puVar6[2] = 0;
    puVar6[3] = 0;
    puVar6[1] = 4;
    memset(puVar6 + 4,0,elemsize);
    *puVar6 = 1;
    a = (void *)((long)puVar6 + elemsize + 0x20);
  }
  a_00 = (void *)((long)a - elemsize);
  ot = *(stbds_hash_index **)((long)a_00 + -0x10);
  if (ot == (stbds_hash_index *)0x0) {
    psVar7 = stbds_make_hash_index(8,(stbds_hash_index *)0x0);
    (psVar7->string).mode = 0 < mode;
  }
  else {
    psVar7 = ot;
    if (ot->used_count < ot->used_count_threshold) goto LAB_00107693;
    psVar7 = stbds_make_hash_index(ot->slot_count * 2,ot);
    free(ot);
  }
  *(stbds_hash_index **)((long)a_00 + -0x10) = psVar7;
LAB_00107693:
  if (mode < 1) {
    uVar8 = stbds_hash_bytes(key,keysize,psVar7->seed);
  }
  else {
    uVar8 = stbds_hash_string((char *)key,psVar7->seed);
  }
  uVar14 = uVar8 | 2;
  if (1 < uVar8) {
    uVar14 = uVar8;
  }
  sVar2 = psVar7->slot_count;
  psVar12 = psVar7->storage;
  uVar13 = 0xffffffffffffffff;
  local_48 = 8;
  uVar8 = uVar14;
  do {
    uVar8 = sVar2 - 1 & uVar8;
    uVar4 = uVar8 & 0xffffffffffffff8;
    uVar15 = (ulong)((uint)uVar8 & 7);
    uVar9 = uVar8 & 0xfffffffffffffff8;
    uVar16 = uVar15;
    do {
      if (psVar12->hash[uVar4 * 2 + uVar16] == uVar14) {
        sVar3 = psVar12->index[uVar4 * 2 + uVar16];
        iVar5 = stbds_is_key_equal(a,elemsize,key,keysize,0,mode,sVar3);
        if (iVar5 != 0) {
          *(size_t *)((long)a_00 + -8) = sVar3;
          if (mode < 1) {
            return a;
          }
          psVar7->temp_key = *(char **)((long)a + elemsize * psVar12->index[uVar4 * 2 + uVar16]);
          return a;
        }
      }
      else {
        if (psVar12->hash[uVar4 * 2 + uVar16] == 0) goto LAB_0010781e;
        if (((long)uVar13 < 0) && (psVar12->index[uVar4 * 2 + uVar16] == -2)) {
          uVar13 = uVar9 + uVar16;
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != 8);
    if (uVar15 != 0) {
      uVar16 = 0;
      do {
        if (psVar12->hash[uVar4 * 2 + uVar16] == uVar14) {
          sVar3 = psVar12->index[uVar4 * 2 + uVar16];
          iVar5 = stbds_is_key_equal(a,elemsize,key,keysize,0,mode,sVar3);
          if (iVar5 != 0) {
            *(size_t *)((long)a_00 + -8) = sVar3;
            return a;
          }
        }
        else {
          if (psVar12->hash[uVar4 * 2 + uVar16] == 0) goto LAB_0010781e;
          if (((long)uVar13 < 0) && (psVar12->index[uVar4 * 2 + uVar16] == -2)) {
            uVar13 = uVar9 + uVar16;
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    uVar8 = uVar8 + local_48;
    local_48 = local_48 + 8;
  } while( true );
LAB_0010781e:
  local_80 = uVar9 + uVar16;
  if (-1 < (long)uVar13) {
    psVar7->tombstone_count = psVar7->tombstone_count - 1;
    local_80 = uVar13;
  }
  psVar7->used_count = psVar7->used_count + 1;
  if (a == (void *)0x0) {
    uVar8 = 1;
    lVar17 = 0;
  }
  else {
    lVar17 = *(long *)((long)a_00 + -0x20);
    uVar8 = lVar17 + 1;
    if (uVar8 <= *(ulong *)((long)a_00 + -0x18)) goto LAB_001078c8;
  }
  a_00 = stbds_arrgrowf(a_00,elemsize,1,0);
  psVar12 = psVar7->storage;
LAB_001078c8:
  *(ulong *)((long)a_00 + -0x20) = uVar8;
  uVar8 = (ulong)((uint)local_80 & 7);
  psVar12->hash[(local_80 & 0xffffffffffffff8) * 2 + uVar8] = uVar14;
  psVar12->index[(local_80 & 0xffffffffffffff8) * 2 + uVar8] = lVar17 + -1;
  *(long *)((long)a_00 + -8) = lVar17 + -1;
  uVar1 = (psVar7->string).mode;
  if (uVar1 == '\x01') {
    *(void **)((long)a_00 + lVar17 * elemsize) = key;
    **(undefined8 **)((long)a_00 + -0x10) = key;
  }
  else if (uVar1 == '\x03') {
    pcVar11 = stbds_stralloc(&psVar7->string,(char *)key);
    *(char **)((long)a_00 + lVar17 * elemsize) = pcVar11;
    **(undefined8 **)((long)a_00 + -0x10) = pcVar11;
  }
  else if (uVar1 == '\x02') {
    sVar10 = strlen((char *)key);
    __dest = malloc(sVar10 + 1);
    memcpy(__dest,key,sVar10 + 1);
    *(void **)((long)a_00 + lVar17 * elemsize) = __dest;
    **(undefined8 **)((long)a_00 + -0x10) = __dest;
  }
  else {
    memcpy((void *)(lVar17 * elemsize + (long)a_00),key,keysize);
  }
  return (void *)((long)a_00 + elemsize);
}

Assistant:

void *stbds_hmput_key(void *a, size_t elemsize, void *key, size_t keysize, int mode)
{
  size_t keyoffset=0;
  void *raw_a;
  stbds_hash_index *table;

  if (a == NULL) {
    a = stbds_arrgrowf(0, elemsize, 0, 1);
    memset(a, 0, elemsize);
    stbds_header(a)->length += 1;
    // adjust a to point AFTER the default element
    a = STBDS_ARR_TO_HASH(a,elemsize);
  }

  // adjust a to point to the default element
  raw_a = a;
  a = STBDS_HASH_TO_ARR(a,elemsize);

  table = (stbds_hash_index *) stbds_header(a)->hash_table;

  if (table == NULL || table->used_count >= table->used_count_threshold) {
    stbds_hash_index *nt;
    size_t slot_count;

    slot_count = (table == NULL) ? STBDS_BUCKET_LENGTH : table->slot_count*2;
    nt = stbds_make_hash_index(slot_count, table);
    if (table)
      STBDS_FREE(NULL, table);
    else
      nt->string.mode = mode >= STBDS_HM_STRING ? STBDS_SH_DEFAULT : 0;
    stbds_header(a)->hash_table = table = nt;
    STBDS_STATS(++stbds_hash_grow);
  }

  // we iterate hash table explicitly because we want to track if we saw a tombstone
  {
    size_t hash = mode >= STBDS_HM_STRING ? stbds_hash_string((char*)key,table->seed) : stbds_hash_bytes(key, keysize,table->seed);
    size_t step = STBDS_BUCKET_LENGTH;
    size_t pos;
    ptrdiff_t tombstone = -1;
    stbds_hash_bucket *bucket;

    // stored hash values are forbidden from being 0, so we can detect empty slots to early out quickly
    if (hash < 2) hash += 2;

    pos = stbds_probe_position(hash, table->slot_count, table->slot_count_log2);

    for (;;) {
      size_t limit, i;
      STBDS_STATS(++stbds_hash_probes);
      bucket = &table->storage[pos >> STBDS_BUCKET_SHIFT];

      // start searching from pos to end of bucket
      for (i=pos & STBDS_BUCKET_MASK; i < STBDS_BUCKET_LENGTH; ++i) {
        if (bucket->hash[i] == hash) {
          if (stbds_is_key_equal(raw_a, elemsize, key, keysize, keyoffset, mode, bucket->index[i])) {
            stbds_temp(a) = bucket->index[i];
            if (mode >= STBDS_HM_STRING)
              stbds_temp_key(a) = * (char **) ((char *) raw_a + elemsize*bucket->index[i] + keyoffset);
            return STBDS_ARR_TO_HASH(a,elemsize);
          }
        } else if (bucket->hash[i] == 0) {
          pos = (pos & ~STBDS_BUCKET_MASK) + i;
          goto found_empty_slot;
        } else if (tombstone < 0) {
          if (bucket->index[i] == STBDS_INDEX_DELETED)
            tombstone = (ptrdiff_t) ((pos & ~STBDS_BUCKET_MASK) + i);
        }
      }

      // search from beginning of bucket to pos
      limit = pos & STBDS_BUCKET_MASK;
      for (i = 0; i < limit; ++i) {
        if (bucket->hash[i] == hash) {
          if (stbds_is_key_equal(raw_a, elemsize, key, keysize, keyoffset, mode, bucket->index[i])) {
            stbds_temp(a) = bucket->index[i];
            return STBDS_ARR_TO_HASH(a,elemsize);
          }
        } else if (bucket->hash[i] == 0) {
          pos = (pos & ~STBDS_BUCKET_MASK) + i;
          goto found_empty_slot;
        } else if (tombstone < 0) {
          if (bucket->index[i] == STBDS_INDEX_DELETED)
            tombstone = (ptrdiff_t) ((pos & ~STBDS_BUCKET_MASK) + i);
        }
      }

      // quadratic probing
      pos += step;
      step += STBDS_BUCKET_LENGTH;
      pos &= (table->slot_count-1);
    }
   found_empty_slot:
    if (tombstone >= 0) {
      pos = tombstone;
      --table->tombstone_count;
    }
    ++table->used_count;

    {
      ptrdiff_t i = (ptrdiff_t) stbds_arrlen(a);
      // we want to do stbds_arraddn(1), but we can't use the macros since we don't have something of the right type
      if ((size_t) i+1 > stbds_arrcap(a))
        *(void **) &a = stbds_arrgrowf(a, elemsize, 1, 0);
      raw_a = STBDS_ARR_TO_HASH(a,elemsize);

      STBDS_ASSERT((size_t) i+1 <= stbds_arrcap(a));
      stbds_header(a)->length = i+1;
      bucket = &table->storage[pos >> STBDS_BUCKET_SHIFT];
      bucket->hash[pos & STBDS_BUCKET_MASK] = hash;
      bucket->index[pos & STBDS_BUCKET_MASK] = i-1;
      stbds_temp(a) = i-1;

      switch (table->string.mode) {
         case STBDS_SH_STRDUP:  stbds_temp_key(a) = *(char **) ((char *) a + elemsize*i) = stbds_strdup((char*) key); break;
         case STBDS_SH_ARENA:   stbds_temp_key(a) = *(char **) ((char *) a + elemsize*i) = stbds_stralloc(&table->string, (char*)key); break;
         case STBDS_SH_DEFAULT: stbds_temp_key(a) = *(char **) ((char *) a + elemsize*i) = (char *) key; break;
         default:                memcpy((char *) a + elemsize*i, key, keysize); break;
      }
    }
    return STBDS_ARR_TO_HASH(a,elemsize);
  }
}